

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::anon_unknown_14::XmlReporter::report_query(XmlReporter *this,QueryData *in)

{
  XmlWriter *pXVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ContextOptions *pCVar4;
  _Base_ptr p_Var5;
  char *attribute;
  TestCaseData *file;
  ulong uVar6;
  ScopedElement scoped_3;
  ScopedElement scoped;
  ScopedElement scoped_2;
  string local_f0;
  string local_d0;
  XmlReporter *local_b0;
  undefined1 local_a8 [32];
  XmlWriter *local_88;
  uint local_7c;
  string local_78;
  ScopedElement local_58;
  string local_50;
  
  (*(this->super_IReporter)._vptr_IReporter[1])();
  pCVar4 = this->opt;
  local_b0 = this;
  if (pCVar4->list_reporters == true) {
    getListeners();
    if ((_Rb_tree_header *)getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        != &getListeners::data._M_t._M_impl.super__Rb_tree_header) {
      pXVar1 = &local_b0->xml;
      p_Var5 = getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Listener","");
        local_78._M_dataplus._M_p = &pXVar1->m_tagIsOpen;
        XmlWriter::startElement(pXVar1,&local_f0);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"priority","");
        XmlWriter::writeAttribute<int>(pXVar1,&local_d0,(int *)(p_Var5 + 1));
        local_a8._0_8_ = (XmlWriter *)(local_a8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"name","");
        XmlWriter::writeAttribute<doctest::String>
                  (pXVar1,(string *)local_a8,(String *)&p_Var5[1]._M_parent);
        if ((XmlWriter *)local_a8._0_8_ != (XmlWriter *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != &getListeners::data._M_t._M_impl.super__Rb_tree_header);
    }
    getReporters();
    if ((_Rb_tree_header *)getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        != &getReporters::data._M_t._M_impl.super__Rb_tree_header) {
      pXVar1 = &local_b0->xml;
      p_Var5 = getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Reporter","");
        local_78._M_dataplus._M_p = &pXVar1->m_tagIsOpen;
        XmlWriter::startElement(pXVar1,&local_f0);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"priority","");
        XmlWriter::writeAttribute<int>(pXVar1,&local_d0,(int *)(p_Var5 + 1));
        local_a8._0_8_ = (XmlWriter *)(local_a8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"name","");
        XmlWriter::writeAttribute<doctest::String>
                  (pXVar1,(string *)local_a8,(String *)&p_Var5[1]._M_parent);
        if ((XmlWriter *)local_a8._0_8_ != (XmlWriter *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != &getReporters::data._M_t._M_impl.super__Rb_tree_header);
    }
  }
  else {
    if ((pCVar4->count == false) && (pCVar4->list_test_cases != true)) {
      if (pCVar4->list_test_suites != true) goto LAB_0010d876;
      if (in->num_data != 0) {
        pXVar1 = &this->xml;
        uVar6 = 0;
        do {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"TestSuite","");
          local_a8._0_8_ = pXVar1;
          XmlWriter::startElement(pXVar1,&local_f0);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"name","");
          XmlWriter::writeAttribute(pXVar1,&local_d0,in->data[uVar6]->m_test_suite);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < in->num_data);
      }
      paVar2 = &local_f0.field_2;
      local_f0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"OverallResultsTestCases","");
      pXVar1 = &local_b0->xml;
      local_a8._0_8_ = pXVar1;
      XmlWriter::startElement(pXVar1,&local_f0);
      paVar3 = &local_d0.field_2;
      local_d0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"unskipped","");
      XmlWriter::writeAttribute<unsigned_int>
                (pXVar1,&local_d0,&in->run_stats->numTestCasesPassingFilters);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar3) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      local_f0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"OverallResultsTestSuites","");
      local_a8._0_8_ = pXVar1;
      XmlWriter::startElement(pXVar1,&local_f0);
      local_d0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"unskipped","");
      XmlWriter::writeAttribute<unsigned_int>
                (pXVar1,&local_d0,&in->run_stats->numTestSuitesPassingFilters);
    }
    else {
      if (in->num_data != 0) {
        local_88 = &this->xml;
        uVar6 = 0;
        do {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"TestCase","");
          local_58.m_writer = local_88;
          XmlWriter::startElement(local_88,&local_f0);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"name","");
          XmlWriter::writeAttribute(local_88,&local_d0,in->data[uVar6]->m_name);
          local_a8._0_8_ = local_a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"testsuite","");
          XmlWriter::writeAttribute(local_88,(string *)local_a8,in->data[uVar6]->m_test_suite);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"filename","");
          file = in->data[uVar6];
          if ((file->m_file).field_0.buf[0x17] < '\0') {
            file = (TestCaseData *)(file->m_file).field_0.data.ptr;
          }
          attribute = skipPathFromFilename((char *)file);
          XmlWriter::writeAttribute(local_88,&local_78,attribute);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"line","");
          local_7c = 0;
          if (local_b0->opt->no_line_numbers == false) {
            local_7c = in->data[uVar6]->m_line;
          }
          XmlWriter::writeAttribute<unsigned_int>(local_88,&local_50,&local_7c);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
            operator_delete((void *)local_a8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          XmlWriter::ScopedElement::~ScopedElement(&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < in->num_data);
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"OverallResultsTestCases","");
      pXVar1 = &local_b0->xml;
      local_a8._0_8_ = pXVar1;
      XmlWriter::startElement(pXVar1,&local_f0);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"unskipped","");
      XmlWriter::writeAttribute<unsigned_int>
                (pXVar1,&local_d0,&in->run_stats->numTestCasesPassingFilters);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
LAB_0010d876:
  XmlWriter::endElement(&local_b0->xml);
  return;
}

Assistant:

void report_query(const QueryData& in) override {
            test_run_start();
            if(opt.list_reporters) {
                for(auto& curr : getListeners())
                    xml.scopedElement("Listener")
                            .writeAttribute("priority", curr.first.first)
                            .writeAttribute("name", curr.first.second);
                for(auto& curr : getReporters())
                    xml.scopedElement("Reporter")
                            .writeAttribute("priority", curr.first.first)
                            .writeAttribute("name", curr.first.second);
            } else if(opt.count || opt.list_test_cases) {
                for(unsigned i = 0; i < in.num_data; ++i) {
                    xml.scopedElement("TestCase").writeAttribute("name", in.data[i]->m_name)
                        .writeAttribute("testsuite", in.data[i]->m_test_suite)
                        .writeAttribute("filename", skipPathFromFilename(in.data[i]->m_file.c_str()))
                        .writeAttribute("line", line(in.data[i]->m_line));
                }
                xml.scopedElement("OverallResultsTestCases")
                        .writeAttribute("unskipped", in.run_stats->numTestCasesPassingFilters);
            } else if(opt.list_test_suites) {
                for(unsigned i = 0; i < in.num_data; ++i)
                    xml.scopedElement("TestSuite").writeAttribute("name", in.data[i]->m_test_suite);
                xml.scopedElement("OverallResultsTestCases")
                        .writeAttribute("unskipped", in.run_stats->numTestCasesPassingFilters);
                xml.scopedElement("OverallResultsTestSuites")
                        .writeAttribute("unskipped", in.run_stats->numTestSuitesPassingFilters);
            }
            xml.endElement();
        }